

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O2

Mat * __thiscall
PatternGeneration::getChessTexture
          (PatternGeneration *this,Scalar *color1,Scalar *color2,int blockSize,int squares)

{
  Mat *pMVar1;
  Scalar *pSVar2;
  undefined4 in_register_0000000c;
  _InputArray *p_Var3;
  int in_R9D;
  int iVar4;
  int iVar5;
  undefined1 local_e8 [8];
  Mat ROI;
  Scalar_<double> local_88;
  Scalar *local_68;
  Scalar *local_60;
  _InputArray local_58;
  Mat *local_40;
  int local_34;
  
  local_68 = (Scalar *)CONCAT44(in_register_0000000c,blockSize);
  iVar4 = in_R9D * squares;
  local_60 = color2;
  cv::Scalar_<double>::all((Scalar_<double> *)local_e8,0.0);
  p_Var3 = (_InputArray *)local_e8;
  local_40 = (Mat *)this;
  local_34 = iVar4;
  cv::Mat::Mat((Mat *)this,iVar4,iVar4,0x10,(Scalar_ *)local_e8);
  cv::Scalar_<double>::Scalar_(&local_88);
  for (iVar4 = 0; pMVar1 = local_40, iVar4 < local_34; iVar4 = iVar4 + squares) {
    for (iVar5 = 0; iVar5 < local_34; iVar5 = iVar5 + squares) {
      local_58.obj = (void *)CONCAT44(squares,squares);
      local_58.flags = iVar4;
      local_58._4_4_ = iVar5;
      cv::Mat::Mat((Mat *)local_e8,local_40,(Rect_ *)&local_58);
      pSVar2 = local_68;
      if ((iVar5 + iVar4 & 1U) == 0) {
        pSVar2 = local_60;
      }
      local_88.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_88.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      local_88.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
      local_88.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
      local_58.flags = -0x3efdfffa;
      local_58.obj = &local_88;
      local_58.sz.width = 1;
      local_58.sz.height = 4;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)local_e8,&local_58);
      cv::Mat::~Mat((Mat *)local_e8);
    }
  }
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_e8._0_4_ = 0x1010000;
  _ROI = local_40;
  local_58.flags = 0x2010000;
  local_58.obj = local_40;
  cv::cvtColor((cv *)local_e8,&local_58,(_OutputArray *)0x39,0,(int)p_Var3);
  return pMVar1;
}

Assistant:

cv::Mat PatternGeneration::getChessTexture(
    const cv::Scalar & color1,
    const cv::Scalar & color2,
    int blockSize,
    int squares)
{
    int imageSize=blockSize*squares;
    cv::Mat chessBoard(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));

    cv::Scalar color_;
    

    for (int i=0;i<imageSize;i=i+blockSize){
        for (int j=0;j<imageSize;j=j+blockSize){
            cv::Mat ROI=chessBoard(cv::Rect(i,j,blockSize,blockSize));
            if ((i+j) % 2 == 0) {
                color_ = color1;
            }
            else {
                color_=color2;
            
            }
            ROI.setTo(color_);
        }
    }


    cvtColor(chessBoard,chessBoard,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return chessBoard;
}